

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifyInlinableBlocks.cpp
# Opt level: O0

void identifyInlinableBlocks(Module *module,Program *program)

{
  bool bVar1;
  BasicBlock *in_RDI;
  Block *myBlock;
  BasicBlock *firstBlock;
  Block *myBlock_1;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Func *function;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Block *in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_78;
  Block *in_stack_ffffffffffffff90;
  Program *in_stack_ffffffffffffff98;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  Func *local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  
  local_28 = llvm::Module::functions((Module *)in_stack_ffffffffffffff80.NodePtr);
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_18);
  while (bVar1 = llvm::operator!=(&local_30,&local_38), bVar1) {
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x291051);
    local_48 = Program::getFunction(in_stack_ffffffffffffff98,(Function *)in_stack_ffffffffffffff90)
    ;
    local_50 = local_40;
    local_58.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffff68);
    local_60.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_ffffffffffffff68);
    while (bVar1 = llvm::operator!=(&local_58,&local_60), bVar1) {
      in_stack_ffffffffffffff98 =
           (Program *)
           llvm::
           ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
           ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                        *)0x2910b4);
      in_stack_ffffffffffffff90 = Func::createBlockIfNotExist((Func *)myBlock,in_RDI);
      bVar1 = isSafeToInline(in_stack_ffffffffffffff78,(Block *)in_stack_ffffffffffffff70.NodePtr);
      in_stack_ffffffffffffff90->doInline = bVar1;
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_stack_ffffffffffffff70.NodePtr);
    }
    local_78.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff80 = llvm::Function::end((Function *)in_stack_ffffffffffffff68);
    bVar1 = llvm::operator==(&local_78,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffff80);
    if (!bVar1) {
      in_stack_ffffffffffffff70 = llvm::Function::begin((Function *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff78 =
           llvm::
           ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
           ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                        *)0x291143);
      in_stack_ffffffffffffff68 = Func::createBlockIfNotExist((Func *)myBlock,in_RDI);
      in_stack_ffffffffffffff68->doInline = false;
      in_stack_ffffffffffffff68->isFirst = true;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff70.NodePtr);
  }
  Program::addPass((Program *)in_stack_ffffffffffffff80.NodePtr,
                   (PassType)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  return;
}

Assistant:

void identifyInlinableBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    assert(program.isPassCompleted(PassType::ParseBreaks));

    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            myBlock->doInline = isSafeToInline(&block, myBlock);
        }

        if (func.begin() == func.end())
            continue;

        // first block is only inlinable if there are no predecessors
        auto& firstBlock = *func.begin();
        auto* myBlock = function->createBlockIfNotExist(&firstBlock);

        myBlock->doInline = false;
        myBlock->isFirst = true;
    }

    program.addPass(PassType::IdentifyInlinableBlocks);
}